

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_random.cpp
# Opt level: O0

void __thiscall BamTools::RandomTool::RandomTool(RandomTool *this)

{
  size_type *psVar1;
  void *pvVar2;
  OptionGroup *argument;
  string *valueDescription;
  OptionGroup *pOVar3;
  string *optionDescription;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  OptionGroup *SettingsOpts;
  OptionGroup *IO_Opts;
  string *in_stack_fffffffffffff988;
  string *in_stack_fffffffffffff990;
  RandomSettings *in_stack_fffffffffffff9c0;
  allocator *paVar4;
  string *in_stack_fffffffffffff9e0;
  OptionGroup *group;
  allocator *foundArgument;
  string *optionDescription_00;
  string *argument_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string *valueTypeDescription;
  OptionGroup *group_00;
  OptionGroup *group_01;
  string *valueTypeDescription_00;
  OptionGroup *group_02;
  string *valueDescription_00;
  string *valueDescription_01;
  OptionGroup *group_03;
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [32];
  OptionGroup *local_398;
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  undefined1 local_221 [40];
  allocator local_1f9;
  string local_1f8 [39];
  undefined1 local_1d1 [40];
  undefined1 local_1a9 [40];
  undefined1 local_181 [40];
  undefined1 local_159 [40];
  undefined1 local_131 [40];
  undefined1 local_109 [40];
  undefined1 local_e1 [40];
  undefined1 local_b9 [33];
  OptionGroup *local_98;
  undefined1 local_89 [40];
  undefined1 local_61 [40];
  undefined1 local_39 [57];
  
  AbstractTool::AbstractTool((AbstractTool *)in_RDI);
  *(undefined ***)in_RDI = &PTR__RandomTool_002680a8;
  psVar1 = &in_RDI->_M_string_length;
  pvVar2 = operator_new(0x90);
  RandomSettings::RandomSettings(in_stack_fffffffffffff9c0);
  *psVar1 = (size_type)pvVar2;
  (in_RDI->field_2)._M_allocated_capacity = 0;
  pOVar3 = (OptionGroup *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_39 + 1),"bamtools random",(allocator *)pOVar3);
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_61 + 1),"grab a random subset of alignments",(allocator *)pbVar5);
  group_03 = (OptionGroup *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_89 + 1),
             "[-in <filename> -in <filename> ... | -list <filelist>] [-out <filename>] [-forceCompression] [-n] [-region <REGION>]"
             ,(allocator *)group_03);
  Options::SetProgramInfo(in_stack_fffffffffffff990,in_stack_fffffffffffff988,(string *)0x14a00e);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  std::__cxx11::string::~string((string *)(local_61 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  valueDescription_01 = (string *)local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_b9 + 1),"Input & Output",(allocator *)valueDescription_01);
  argument = Options::CreateOptionGroup(in_stack_fffffffffffff9e0);
  std::__cxx11::string::~string((string *)(local_b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b9);
  valueDescription_00 = (string *)local_e1;
  local_98 = argument;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_e1 + 1),"-in",(allocator *)valueDescription_00);
  group_02 = (OptionGroup *)local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_109 + 1),"BAM filename",(allocator *)group_02);
  valueTypeDescription_00 = (string *)local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_131 + 1),"the input BAM file",(allocator *)valueTypeDescription_00);
  group_01 = (OptionGroup *)local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_159 + 1),"",(allocator *)group_01);
  optionDescription = (string *)(in_RDI->_M_string_length + 1);
  valueTypeDescription = (string *)(in_RDI->_M_string_length + 0x10);
  group_00 = local_98;
  valueDescription = Options::StandardIn_abi_cxx11_();
  Options::
  AddValueOption<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const>
            (&argument->Name,valueDescription_00,&group_02->Name,valueTypeDescription_00,
             (bool *)group_01,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)valueDescription,group_03,pbVar5);
  std::__cxx11::string::~string((string *)(local_159 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_159);
  std::__cxx11::string::~string((string *)(local_131 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_131);
  std::__cxx11::string::~string((string *)(local_109 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_109);
  std::__cxx11::string::~string((string *)(local_e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e1);
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_181;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_181 + 1),"-list",(allocator *)pbVar5);
  argument_00 = (string *)local_1a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1a9 + 1),"filename",(allocator *)argument_00);
  optionDescription_00 = (string *)local_1d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1d1 + 1),"the input BAM file list, one line per file",
             (allocator *)optionDescription_00);
  foundArgument = &local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"",foundArgument);
  Options::AddValueOption<std::__cxx11::string>
            (&group_01->Name,valueDescription,&group_00->Name,valueTypeDescription,
             (bool *)optionDescription,pbVar5,group_02);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string((string *)(local_1d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1d1);
  std::__cxx11::string::~string((string *)(local_1a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1a9);
  std::__cxx11::string::~string((string *)(local_181 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_181);
  group = (OptionGroup *)local_221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_221 + 1),"-out",(allocator *)group);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"BAM filename",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"the output BAM file",&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"",&local_299);
  Options::StandardOut_abi_cxx11_();
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&group_03->Name,valueDescription_01,&argument->Name,valueDescription_00,
             (bool *)group_02,valueTypeDescription_00,pOVar3,in_RDI);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string((string *)(local_221 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"-region",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"REGION",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_310,
             "only pull random alignments from within this genomic region. Index file is recommended for better performance, and is used automatically if it exists. See \'bamtools help index\' for more details on creating one"
             ,&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"",&local_339);
  Options::AddValueOption<std::__cxx11::string>
            (&group_01->Name,valueDescription,&group_00->Name,valueTypeDescription,
             (bool *)optionDescription,pbVar5,group_02);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"-forceCompression",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_388,
             "if results are sent to stdout (like when piping to another tool), default behavior is to leave output uncompressed. Use this flag to override and force compression"
             ,&local_389);
  Options::AddOption(argument_00,optionDescription_00,(bool *)foundArgument,group);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"Settings",&local_3b9);
  pOVar3 = Options::CreateOptionGroup(in_stack_fffffffffffff9e0);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  local_398 = pOVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"-n",&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"count",&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_430,"number of alignments to grab. Note - no duplicate checking is performed",
             &local_431);
  paVar4 = &local_459;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"",paVar4);
  Options::AddValueOption<unsigned_int,unsigned_int_const>
            (&group_00->Name,valueTypeDescription,optionDescription,pbVar5,(bool *)argument_00,
             (uint *)optionDescription_00,group_01,(uint *)valueTypeDescription_00);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"-seed",&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a8,"unsigned integer",&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4d0,
             "random number generator seed (for repeatable results). Current time is used if no seed value is provided."
             ,&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"",&local_4f9);
  Options::AddValueOption<unsigned_int>
            (optionDescription,pbVar5,argument_00,optionDescription_00,(bool *)foundArgument,
             (uint *)group,group_00);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  return;
}

Assistant:

RandomTool::RandomTool()
    : AbstractTool()
    , m_settings(new RandomSettings)
    , m_impl(0)
{
    // set program details
    Options::SetProgramInfo("bamtools random", "grab a random subset of alignments",
                            "[-in <filename> -in <filename> ... | -list <filelist>] [-out "
                            "<filename>] [-forceCompression] [-n] [-region <REGION>]");

    // set up options
    OptionGroup* IO_Opts = Options::CreateOptionGroup("Input & Output");
    Options::AddValueOption("-in", "BAM filename", "the input BAM file", "", m_settings->HasInput,
                            m_settings->InputFiles, IO_Opts, Options::StandardIn());
    Options::AddValueOption("-list", "filename", "the input BAM file list, one line per file", "",
                            m_settings->HasInputFilelist, m_settings->InputFilelist, IO_Opts);
    Options::AddValueOption("-out", "BAM filename", "the output BAM file", "",
                            m_settings->HasOutput, m_settings->OutputFilename, IO_Opts,
                            Options::StandardOut());
    Options::AddValueOption("-region", "REGION",
                            "only pull random alignments from within this genomic region. Index "
                            "file is recommended for better performance, and is used automatically "
                            "if it exists. See \'bamtools help index\' for more details on "
                            "creating one",
                            "", m_settings->HasRegion, m_settings->Region, IO_Opts);
    Options::AddOption("-forceCompression",
                       "if results are sent to stdout (like when piping to another tool), default "
                       "behavior is to leave output uncompressed. Use this flag to override and "
                       "force compression",
                       m_settings->IsForceCompression, IO_Opts);

    OptionGroup* SettingsOpts = Options::CreateOptionGroup("Settings");
    Options::AddValueOption(
        "-n", "count", "number of alignments to grab. Note - no duplicate checking is performed",
        "", m_settings->HasAlignmentCount, m_settings->AlignmentCount, SettingsOpts,
        RANDOM_MAX_ALIGNMENT_COUNT);
    Options::AddValueOption("-seed", "unsigned integer",
                            "random number generator seed (for repeatable results). Current time "
                            "is used if no seed value is provided.",
                            "", m_settings->HasRandomNumberSeed, m_settings->RandomNumberSeed,
                            SettingsOpts);
}